

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<std::complex<long_double>_>::Subst_Forward
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *B)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar2;
  int64_t i;
  long lVar3;
  int64_t c;
  long lVar4;
  int64_t r;
  long lVar5;
  longdouble local_d0;
  longdouble local_c4;
  complex<long_double> __r;
  undefined8 local_98 [4];
  complex<long_double> pivot;
  complex<long_double> local_58;
  
  lVar5 = (B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  iVar2 = 0;
  if ((lVar5 == CONCAT44(extraout_var,iVar1)) && ((this->super_TPZBaseMatrix).fDecomposed == '\x03')
     ) {
    lVar5 = 0;
    while( true ) {
      iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
      if (CONCAT44(extraout_var_00,iVar1) <= lVar5) break;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&pivot,this,lVar5,lVar5);
      for (lVar4 = 0;
          lVar4 < (B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
          lVar4 = lVar4 + 1) {
        local_d0 = (longdouble)0;
        local_c4 = local_d0;
        for (lVar3 = 0; lVar5 != lVar3; lVar3 = lVar3 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (local_98,this,lVar5,lVar3);
          (*(B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(&local_58,B,lVar3,lVar4);
          __r._M_value._16_8_ = local_98[2];
          __r._M_value._24_2_ = (undefined2)local_98[3];
          __r._M_value._26_4_ = local_98[3]._2_4_;
          __r._M_value._30_2_ = local_98[3]._6_2_;
          __r._M_value._0_8_ = local_98[0];
          __r._M_value._8_2_ = (undefined2)local_98[1];
          __r._M_value._10_4_ = local_98[1]._2_4_;
          __r._M_value._14_2_ = local_98[1]._6_2_;
          std::complex<long_double>::operator*=(&__r,&local_58);
          local_c4 = local_c4 + (longdouble)CONCAT28(__r._M_value._8_2_,__r._M_value._0_8_);
          local_d0 = local_d0 + (longdouble)CONCAT28(__r._M_value._24_2_,__r._M_value._16_8_);
        }
        (*(B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x24])(local_98,B,lVar5,lVar4);
        __r._M_value._14_2_ = local_98[1]._6_2_;
        __r._M_value._10_4_ = local_98[1]._2_4_;
        __r._M_value._30_2_ = local_98[3]._6_2_;
        __r._M_value._26_4_ = local_98[3]._2_4_;
        local_c4 = (longdouble)CONCAT28((undefined2)local_98[1],local_98[0]) - local_c4;
        local_d0 = (longdouble)CONCAT28((undefined2)local_98[3],local_98[2]) - local_d0;
        __r._M_value._0_8_ = SUB108(local_c4,0);
        __r._M_value._8_2_ = SUB102((unkuint10)local_c4 >> 0x40,0);
        __r._M_value._16_8_ = SUB108(local_d0,0);
        __r._M_value._24_2_ = SUB102((unkuint10)local_d0 >> 0x40,0);
        std::complex<long_double>::operator/=(&__r,&pivot);
        (*(B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x23])(B,lVar5,lVar4,&__r);
      }
      lVar5 = lVar5 + 1;
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int TPZMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky)
		return( 0 );
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols();  c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
			//
			TVar sum = 0.0;
			for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
			// Faz B[r,c] = (B[r,c] - sum) / A[r,r].
			//
			B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
		}
	}
	return( 1 );
}